

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableP<deqp::gls::BuiltinPrecisionTests::Void>::VariableP
          (VariableP<deqp::gls::BuiltinPrecisionTests::Void> *this,
          Variable<deqp::gls::BuiltinPrecisionTests::Void> *ptr)

{
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *ptr_local;
  VariableP<deqp::gls::BuiltinPrecisionTests::Void> *this_local;
  
  de::
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::SharedPtr(&this->
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ,ptr);
  return;
}

Assistant:

explicit	VariableP	(const Variable<T>* ptr) : Super(ptr) {}